

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_for_testing.hpp
# Opt level: O0

void HelpersForTests::print_nz_inds<std::array<bool,1024ul>>(array<bool,_1024UL> *vec)

{
  const_iterator pvVar1;
  ostream *poVar2;
  value_type_conflict1 val;
  const_iterator __end0;
  const_iterator __begin0;
  array<bool,_1024UL> *__range2;
  size_t i;
  array<bool,_1024UL> *vec_local;
  
  __range2 = (array<bool,_1024UL> *)0x0;
  __end0 = std::array<bool,_1024UL>::begin(vec);
  pvVar1 = std::array<bool,_1024UL>::end(vec);
  for (; __end0 != pvVar1; __end0 = __end0 + 1) {
    if ((*__end0 & 1U) != 0) {
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(ulong)__range2);
      std::operator<<(poVar2,' ');
    }
    __range2 = (array<bool,_1024UL> *)(__range2->_M_elems + 1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_nz_inds(const T &vec) {
        std::size_t i{};
        for (auto val : vec) {
            if (val != 0) {
                std::cout << i << ' ';
            }
            i++;
        }
        std::cout << std::endl;
    }